

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

AdamOptimizer * __thiscall CoreML::Specification::Optimizer::mutable_adamoptimizer(Optimizer *this)

{
  AdamOptimizer *this_00;
  
  if (this->_oneof_case_[0] == 0xb) {
    this_00 = (AdamOptimizer *)(this->OptimizerType_).sgdoptimizer_;
  }
  else {
    clear_OptimizerType(this);
    this->_oneof_case_[0] = 0xb;
    this_00 = (AdamOptimizer *)operator_new(0x40);
    AdamOptimizer::AdamOptimizer(this_00);
    (this->OptimizerType_).adamoptimizer_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::AdamOptimizer* Optimizer::mutable_adamoptimizer() {
  if (!has_adamoptimizer()) {
    clear_OptimizerType();
    set_has_adamoptimizer();
    OptimizerType_.adamoptimizer_ = new ::CoreML::Specification::AdamOptimizer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Optimizer.adamOptimizer)
  return OptimizerType_.adamoptimizer_;
}